

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

string * __thiscall AST::toStringTree_abi_cxx11_(string *__return_storage_ptr__,AST *this)

{
  AST *pAVar1;
  string local_48;
  RefCount<AST> local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_48._M_dataplus._M_p = (pointer)(this->down).ref;
  if ((Ref *)local_48._M_dataplus._M_p == (Ref *)0x0) {
    local_48._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    ((Ref *)local_48._M_dataplus._M_p)->count = ((Ref *)local_48._M_dataplus._M_p)->count + 1;
  }
  if ((Ref *)local_48._M_dataplus._M_p == (Ref *)0x0) {
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_48);
  }
  else {
    pAVar1 = ((Ref *)local_48._M_dataplus._M_p)->ptr;
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_48);
    if (pAVar1 != (AST *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getText_abi_cxx11_(&local_48,this);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      local_28.ref = (this->down).ref;
      (local_28.ref)->count = (local_28.ref)->count + 1;
      toStringList_abi_cxx11_(&local_48,(local_28.ref)->ptr);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      RefCount<AST>::~RefCount(&local_28);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getText_abi_cxx11_(&local_48,this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AST::toStringTree() const
{
	//const AST* t=this;
	std::string ts="";
	if (getFirstChild()) {
		ts+=" ( ";
		ts+=toString();
		ts+=getFirstChild()->toStringList();
		ts+=" )";
	} else {
		ts+=" ";
		ts+=toString();
	}
	return ts;
}